

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

errr Infoclr_nuke(void)

{
  infoclr *piVar1;
  
  piVar1 = Infoclr;
  if ((Infoclr->field_0x18 & 0x20) != 0) {
    piVar1 = (infoclr *)XFreeGC(metadpy_default_0,Infoclr->gc);
  }
  Infoclr = (infoclr *)0x0;
  return (errr)piVar1;
}

Assistant:

static errr Infoclr_nuke(void)
{
	infoclr *iclr = Infoclr;

	/* Deal with 'GC' */
	if (iclr->nuke) {
		/* Free the GC */
		XFreeGC(Metadpy->dpy, iclr->gc);
	}

	/* Forget the current */
	Infoclr = (infoclr*)(NULL);

	/* Success */
	return (0);
}